

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.cpp
# Opt level: O2

void __thiscall sf::Texture::Texture(Texture *this,Texture *copy)

{
  bool bVar1;
  Uint64 UVar2;
  ostream *poVar3;
  
  GlResource::GlResource((GlResource *)this);
  this->m_texture = 0;
  (this->m_size).x = 0;
  (this->m_size).y = 0;
  (this->m_actualSize).x = 0;
  (this->m_actualSize).y = 0;
  this->m_isSmooth = copy->m_isSmooth;
  this->m_sRgb = copy->m_sRgb;
  this->m_isRepeated = copy->m_isRepeated;
  this->m_pixelsFlipped = false;
  this->m_fboAttachment = false;
  this->m_hasMipmap = false;
  UVar2 = anon_unknown.dwarf_95ac5::getUniqueId();
  this->m_cacheId = UVar2;
  if (copy->m_texture != 0) {
    bVar1 = create(this,(copy->m_size).x,(copy->m_size).y);
    if (bVar1) {
      update(this,copy);
      glFlush();
      priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/thirdparty/SFML/src/SFML/Graphics/Texture.cpp"
                         ,0x62,"glFlush()");
    }
    else {
      poVar3 = err();
      poVar3 = std::operator<<(poVar3,"Failed to copy texture, failed to create new texture");
      std::endl<char,std::char_traits<char>>(poVar3);
    }
  }
  return;
}

Assistant:

Texture::Texture(const Texture& copy) :
m_size         (0, 0),
m_actualSize   (0, 0),
m_texture      (0),
m_isSmooth     (copy.m_isSmooth),
m_sRgb         (copy.m_sRgb),
m_isRepeated   (copy.m_isRepeated),
m_pixelsFlipped(false),
m_fboAttachment(false),
m_hasMipmap    (false),
m_cacheId      (getUniqueId())
{
    if (copy.m_texture)
    {
        if (create(copy.getSize().x, copy.getSize().y))
        {
            update(copy);

            // Force an OpenGL flush, so that the texture will appear updated
            // in all contexts immediately (solves problems in multi-threaded apps)
            glCheck(glFlush());
        }
        else
        {
            err() << "Failed to copy texture, failed to create new texture" << std::endl;
        }
    }
}